

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

string * __thiscall
wabt::(anonymous_namespace)::BinaryReaderObjdumpDisassemble::BlockSigToString_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Type type)

{
  Type local_10;
  
  local_10 = (Type)this;
  if ((int)this < 0) {
    if ((int)this == -0x40) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    else {
      Type::GetName_abi_cxx11_(__return_storage_ptr__,&local_10);
    }
  }
  else {
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"type[%d]");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BinaryReaderObjdumpDisassemble::BlockSigToString(Type type) const {
  if (type.IsIndex()) {
    return StringPrintf("type[%d]", type.GetIndex());
  } else if (type == Type::Void) {
    return "";
  } else {
    return type.GetName();
  }
}